

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O1

int QTest::qt_asprintf(QTestCharBuffer *str,char *format,...)

{
  char in_AL;
  bool bVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int newSize;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Da;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  newSize = str->_size;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  do {
    puStack_50 = &stack0x00000008;
    local_58 = 0x3000000010;
    local_48 = auStack_108;
    iVar2 = __vsnprintf_chk(str->buf,(long)newSize,1,0xffffffffffffffff,format,&local_58);
    if ((0x100000 < newSize) || (-1 < iVar2 && iVar2 < newSize)) break;
    newSize = newSize * 2;
    bVar1 = QTestCharBuffer::reset(str,newSize,false);
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int qt_asprintf(QTestCharBuffer *str, const char *format, ...)
{
    Q_ASSERT(str);
    int size = str->size();
    Q_ASSERT(size > 0);

    va_list ap;
    int res = 0;

    do {
        va_start(ap, format);
        res = std::vsnprintf(str->data(), size, format, ap);
        va_end(ap);
        // vsnprintf() reliably '\0'-terminates
        Q_ASSERT(res < 0 || str->data()[res < size ? res : size - 1] == '\0');
        // Note, we're assuming that a result of -1 is always due to running out of space.
        if (res >= 0 && res < size) // Success
            break;

        // Buffer wasn't big enough, try again:
        size *= 2;
        // If too large or out of memory, take what we have:
    } while (size <= MAXSIZE && str->reset(size));

    return res;
}